

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_read_binary(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  ulong local_40;
  size_t n;
  size_t j;
  size_t i;
  int ret;
  size_t buflen_local;
  uchar *buf_local;
  mbedtls_mpi *X_local;
  
  for (local_40 = 0; (local_40 < buflen && (buf[local_40] == '\0')); local_40 = local_40 + 1) {
  }
  i._4_4_ = mbedtls_mpi_grow(X,(buflen - local_40 >> 3) +
                               (long)(int)(uint)((buflen - local_40 & 7) != 0));
  if ((i._4_4_ == 0) && (i._4_4_ = mbedtls_mpi_lset(X,0), i._4_4_ == 0)) {
    n = 0;
    for (j = buflen; local_40 < j; j = j - 1) {
      X->p[n >> 3] = (ulong)buf[j - 1] << (sbyte)((n & 7) << 3) | X->p[n >> 3];
      n = n + 1;
    }
  }
  return i._4_4_;
}

Assistant:

int mbedtls_mpi_read_binary( mbedtls_mpi *X, const unsigned char *buf, size_t buflen )
{
    int ret;
    size_t i, j, n;

    for( n = 0; n < buflen; n++ )
        if( buf[n] != 0 )
            break;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, CHARS_TO_LIMBS( buflen - n ) ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

    for( i = buflen, j = 0; i > n; i--, j++ )
        X->p[j / ciL] |= ((mbedtls_mpi_uint) buf[i - 1]) << ((j % ciL) << 3);

cleanup:

    return( ret );
}